

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Operations::Operations(Operations *this,int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  undefined1 *__nbytes;
  undefined8 *in_RDX;
  void *__buf;
  Configuration *in_RDI;
  ifstream in;
  path *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *p;
  size_type *this_00;
  allocator_type *in_stack_fffffffffffffcf8;
  __node_base *s;
  char **in_stack_fffffffffffffd00;
  size_type *this_01;
  char **in_stack_fffffffffffffd08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd10;
  undefined1 local_258 [152];
  Configuration *in_stack_fffffffffffffe40;
  undefined1 local_2d [20];
  allocator local_19;
  undefined8 *local_18;
  
  local_18 = in_RDX;
  Configuration::Configuration(in_stack_fffffffffffffe40);
  *(undefined4 *)&in_RDI[1].companyName = 0;
  in_RDI[1].companyName.field_0x4 = 0;
  pcVar1 = (char *)*local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&in_RDI[1].companyName._M_string_length,pcVar1,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(Operations::*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(Operations::*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(Operations::*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(Operations::*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>_>
         *)0x16f81c);
  __nbytes = local_2d;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x16f863);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char_const**,void>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x16f88b);
  p = &in_RDI[1].cmakeVersion.field_2;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                   *)0x16f8a1);
  this_00 = &in_RDI[1].cycleColor._M_string_length;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
                   *)0x16f8b7);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x16f8cd);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x16f8e3);
  s = &in_RDI[1].addExecutableAliases._M_h._M_before_begin;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x16f8f9);
  this_01 = &in_RDI[1].addIgnores._M_h._M_bucket_count;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x16f90f);
  boost::filesystem::path::path((path *)0x16f925);
  boost::filesystem::path::path((path *)0x16f93b);
  *(undefined1 *)&in_RDI[1].componentLocLowerLimit = 0;
  boost::filesystem::path::path((path *)this_01,(value_type *)s);
  bVar2 = boost::filesystem::is_regular_file
                    ((path *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
  boost::filesystem::path::~path((path *)0x16f97d);
  if ((bVar2 & 1) != 0) {
    boost::filesystem::path::path((path *)this_01,(value_type *)s);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)this_00,(path *)p);
    boost::filesystem::path::~path((path *)0x16f9c4);
    Configuration::read(in_RDI,(int)local_258,__buf,(size_t)__nbytes);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)
               CONCAT17(bVar2,in_stack_fffffffffffffcd0));
  }
  RegisterCommands((Operations *)in.super_basic_ifstream<char,_std::char_traits<char>_>._384_8_);
  boost::filesystem::current_path();
  boost::filesystem::path::operator=
            ((path *)CONCAT17(bVar2,in_stack_fffffffffffffcd0),in_stack_fffffffffffffcc8);
  boost::filesystem::path::operator=
            ((path *)CONCAT17(bVar2,in_stack_fffffffffffffcd0),in_stack_fffffffffffffcc8);
  boost::filesystem::path::~path((path *)0x16fb18);
  return;
}

Assistant:

Operations(int argc, const char** argv)
    : loadStatus(Unloaded)
    , inferredComponents(false)
    , programName(argv[0])
    , allArgs(argv+1, argv+argc)
    , recursive(false)
    {
        if (filesystem::is_regular_file(CONFIG_FILE)) {
            streams::ifstream in(CONFIG_FILE);
            config.read(in);
        }
        RegisterCommands();
        projectRoot = outputRoot = filesystem::current_path();
    }